

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.cpp
# Opt level: O2

size_t header_callback(char *buffer,size_t size,size_t nitems,curl_off_t *userdata)

{
  char *pcVar1;
  long lVar2;
  undefined8 uStack_30;
  
  lVar2 = -(nitems + 0x10 & 0xfffffffffffffff0);
  pcVar1 = &stack0xffffffffffffffd8 + lVar2;
  *(undefined8 *)((long)&uStack_30 + lVar2) = 0x1034c5;
  copy_and_low(buffer,pcVar1,nitems);
  pcVar1[nitems - 2] = '\0';
  *(undefined8 *)((long)&uStack_30 + lVar2) = 0x1034da;
  pcVar1 = strstr(pcVar1,"content-length: ");
  if (pcVar1 != (char *)0x0) {
    *(undefined8 *)((long)&uStack_30 + lVar2) = 0x1034ef;
    lVar2 = strtol(pcVar1 + 0x10,(char **)0x0,0);
    *userdata = lVar2;
  }
  return nitems * size;
}

Assistant:

static size_t header_callback(char *buffer, size_t size, size_t nitems, curl_off_t *userdata) {
    char head_data[nitems + 1];
    copy_and_low(buffer, head_data, nitems);
    head_data[nitems - 2] = 0;
    char *head_occur_position = strstr(head_data, "content-length: ");
    if (head_occur_position) {
        *userdata = strtol(head_occur_position + sizeof("content-length: ") - 1, nullptr, 0);
    }
    return nitems * size;
}